

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_increment_node_count
          (Impl *this,SPIRVModule *param_1,bool per_thread)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Id IVar1;
  char *name;
  Function *this_00;
  Block *pBVar2;
  pointer pIVar3;
  pointer pIVar4;
  size_t sVar5;
  Block *local_248;
  Block *local_1b0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1a0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_198;
  Id local_18c;
  undefined4 local_188;
  Id is_first_lane_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_180;
  __single_object is_first_lane;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_170;
  __single_object load_local_index;
  Id local_invocation_index;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_158;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_150;
  Block *local_148;
  Block *body;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_138;
  __single_object atomic_op;
  Op local_128;
  Id local_124;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_120;
  __single_object chain_index_op;
  Op local_110;
  Id local_10c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_108;
  __single_object cast_op;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_e0;
  Id local_c8;
  Id local_c4;
  Id struct_type_id;
  Id uint_array_type;
  Block *merge_block;
  Block *body_block;
  undefined1 local_a8 [4];
  Id total_count_id;
  allocator_type local_8d;
  Id local_8c;
  Op local_88;
  Op local_84;
  iterator local_80;
  undefined8 local_78;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_70;
  Function *local_58;
  Function *func;
  Op local_48;
  Id uint64_type;
  Id uint_type;
  Id bool_type;
  Block *entry;
  Block *current_build_point;
  Id *call_id;
  SPIRVModule *pSStack_20;
  bool per_thread_local;
  SPIRVModule *param_1_local;
  Impl *this_local;
  
  if (per_thread) {
    local_1b0 = (Block *)&this->increment_thread_node_count_call_id;
  }
  else {
    local_1b0 = (Block *)&this->increment_group_node_count_call_id;
  }
  current_build_point = local_1b0;
  if (*(Id *)&local_1b0->_vptr_Block == 0) {
    call_id._7_1_ = per_thread;
    pSStack_20 = param_1;
    param_1_local = (SPIRVModule *)this;
    entry = spv::Builder::getBuildPoint(&this->builder);
    _uint_type = (Block *)0x0;
    uint64_type = spv::Builder::makeBoolType(&this->builder);
    local_48 = spv::Builder::makeUintType(&this->builder,0x20);
    func._4_4_ = spv::Builder::makeUintType(&this->builder,0x40);
    IVar1 = spv::Builder::makeVoidType(&this->builder);
    name = "IncrementGroupNodeCount";
    if ((call_id._7_1_ & 1) != 0) {
      name = "IncrementThreadNodeCount";
    }
    local_8c = func._4_4_;
    local_88 = local_48;
    local_84 = local_48;
    local_80 = &local_8c;
    local_78 = 3;
    __l_00._M_len = 3;
    __l_00._M_array = local_80;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_70,__l_00,&local_8d);
    memset(local_a8,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)local_a8);
    this_00 = spv::Builder::makeFunctionEntry
                        (&this->builder,DecorationMax,IVar1,name,&local_70,
                         (Vector<dxil_spv::Vector<Decoration>_> *)local_a8,(Block **)&uint_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)local_a8);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_70);
    local_58 = this_00;
    IVar1 = spv::Function::getParamId(this_00,0);
    spv::Builder::addName(&this->builder,IVar1,"AtomicCountersBDA");
    IVar1 = spv::Function::getParamId(local_58,1);
    spv::Builder::addName(&this->builder,IVar1,"NodeMetadataIndex");
    IVar1 = spv::Function::getParamId(local_58,2);
    spv::Builder::addName(&this->builder,IVar1,"Count");
    sVar5 = 2;
    body_block._4_4_ = spv::Function::getParamId(local_58,2);
    merge_block = (Block *)0x0;
    _struct_type_id = (Block *)0x0;
    if ((call_id._7_1_ & 1) == 0) {
      pBVar2 = (Block *)spv::Block::operator_new((Block *)0x78,sVar5);
      IVar1 = spv::Builder::getUniqueId(&this->builder);
      sVar5 = (size_t)IVar1;
      spv::Block::Block(pBVar2,IVar1,local_58);
      merge_block = pBVar2;
      pBVar2 = (Block *)spv::Block::operator_new((Block *)0x78,sVar5);
      IVar1 = spv::Builder::getUniqueId(&this->builder);
      spv::Block::Block(pBVar2,IVar1,local_58);
      _struct_type_id = pBVar2;
    }
    local_c4 = spv::Builder::makeRuntimeArray(&this->builder,local_48);
    spv::Builder::addDecoration(&this->builder,local_c4,DecorationArrayStride,4);
    cast_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = local_48;
    __l._M_len = 3;
    __l._M_array = (iterator)
                   ((long)&cast_op._M_t.
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_e0,__l,
               (allocator_type *)
               ((long)&cast_op._M_t.
                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 3));
    IVar1 = spv::Builder::makeStructType(&this->builder,&local_e0,"NodeAtomicsEmpty");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_e0);
    local_c8 = IVar1;
    spv::Builder::addDecoration(&this->builder,IVar1,DecorationBlock,-1);
    spv::Builder::addMemberName(&this->builder,local_c8,0,"payloadCount");
    spv::Builder::addMemberName(&this->builder,local_c8,1,"fusedCount");
    spv::Builder::addMemberName(&this->builder,local_c8,2,"perNodeTotal");
    spv::Builder::addMemberDecoration(&this->builder,local_c8,0,DecorationOffset,0);
    spv::Builder::addMemberDecoration(&this->builder,local_c8,1,DecorationOffset,4);
    spv::Builder::addMemberDecoration(&this->builder,local_c8,2,DecorationOffset,8);
    local_10c = spv::Builder::getUniqueId(&this->builder);
    local_110 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_c8)
    ;
    chain_index_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x7c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_108,&local_10c,&local_110);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    IVar1 = spv::Function::getParamId(local_58,0);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_124 = spv::Builder::getUniqueId(&this->builder);
    local_128 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_48)
    ;
    atomic_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_120,&local_124,&local_128);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_120);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    IVar1 = spv::Instruction::getResultId(pIVar4);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_120);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_120);
    IVar1 = spv::Function::getParamId(local_58,1);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    body._4_4_ = spv::Builder::getUniqueId(&this->builder);
    body._0_4_ = 0xea;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_138,(uint *)((long)&body + 4),&local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_120);
    IVar1 = spv::Instruction::getResultId(pIVar4);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_138);
    spv::Instruction::addIdOperand(pIVar3,body_block._4_4_);
    if ((call_id._7_1_ & 1) == 0) {
      local_248 = merge_block;
    }
    else {
      local_248 = _uint_type;
    }
    local_148 = local_248;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_150,&local_108);
    add_instruction(this,local_248,&local_150);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_150);
    pBVar2 = local_148;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_158,&local_120);
    add_instruction(this,pBVar2,&local_158);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_158);
    pBVar2 = local_148;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &stack0xfffffffffffffea0,&local_138);
    add_instruction(this,pBVar2,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &stack0xfffffffffffffea0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &stack0xfffffffffffffea0);
    if ((call_id._7_1_ & 1) == 0) {
      load_local_index._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           get_builtin_shader_input(this,BuiltInLocalInvocationIndex);
      is_first_lane._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      is_first_lane._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x3d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_170,
                 (uint *)((long)&is_first_lane._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_170);
      spv::Instruction::addIdOperand
                (pIVar3,load_local_index._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      is_first_lane_id = spv::Builder::getUniqueId(&this->builder);
      local_188 = 0xaa;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_180,&is_first_lane_id,&uint64_type);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_180);
      pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_170);
      IVar1 = spv::Instruction::getResultId(pIVar4);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_180);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_180);
      local_18c = spv::Instruction::getResultId(pIVar3);
      pBVar2 = _uint_type;
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_198,&local_170);
      add_instruction(this,pBVar2,&local_198);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_198);
      pBVar2 = _uint_type;
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_1a0,&local_180);
      add_instruction(this,pBVar2,&local_1a0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_1a0);
      spv::Builder::setBuildPoint(&this->builder,_uint_type);
      spv::Builder::createSelectionMerge(&this->builder,_struct_type_id,0);
      spv::Builder::createConditionalBranch(&this->builder,local_18c,merge_block,_struct_type_id);
      spv::Builder::setBuildPoint(&this->builder,merge_block);
      spv::Builder::createBranch(&this->builder,_struct_type_id);
      spv::Builder::setBuildPoint(&this->builder,_struct_type_id);
      spv::Builder::makeReturn(&this->builder,false,0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_180);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_170);
    }
    else {
      spv::Builder::setBuildPoint(&this->builder,_uint_type);
      spv::Builder::makeReturn(&this->builder,false,0);
    }
    spv::Builder::setBuildPoint(&this->builder,entry);
    IVar1 = spv::Function::getId(local_58);
    *(Id *)&current_build_point->_vptr_Block = IVar1;
    this_local._4_4_ = spv::Function::getId(local_58);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_138);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_120);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_108);
  }
  else {
    this_local._4_4_ = *(Id *)&local_1b0->_vptr_Block;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_increment_node_count(SPIRVModule &, bool per_thread)
{
	auto &call_id = per_thread ? increment_thread_node_count_call_id : increment_group_node_count_call_id;
	if (call_id)
		return call_id;
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uint64_type = builder.makeUintType(64);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(),
	                                       per_thread ? "IncrementThreadNodeCount" : "IncrementGroupNodeCount",
	                                       { uint64_type, uint_type, uint_type },
	                                       {}, &entry);

	builder.addName(func->getParamId(0), "AtomicCountersBDA");
	builder.addName(func->getParamId(1), "NodeMetadataIndex");
	builder.addName(func->getParamId(2), "Count");

	spv::Id total_count_id = func->getParamId(2);

	spv::Block *body_block = nullptr;
	spv::Block *merge_block = nullptr;

	if (!per_thread)
	{
		body_block = new spv::Block(builder.getUniqueId(), *func);
		merge_block = new spv::Block(builder.getUniqueId(), *func);
	}

	spv::Id uint_array_type = builder.makeRuntimeArray(uint_type);
	builder.addDecoration(uint_array_type, spv::DecorationArrayStride, 4);
	spv::Id struct_type_id = builder.makeStructType({ uint_type, uint_type, uint_array_type }, "NodeAtomicsEmpty");
	builder.addDecoration(struct_type_id, spv::DecorationBlock);
	builder.addMemberName(struct_type_id, 0, "payloadCount");
	builder.addMemberName(struct_type_id, 1, "fusedCount");
	builder.addMemberName(struct_type_id, 2, "perNodeTotal");
	builder.addMemberDecoration(struct_type_id, 0, spv::DecorationOffset, 0);
	builder.addMemberDecoration(struct_type_id, 1, spv::DecorationOffset, 4);
	builder.addMemberDecoration(struct_type_id, 2, spv::DecorationOffset, 8);

	auto cast_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(),
	    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, struct_type_id),
	    spv::OpBitcast);
	cast_op->addIdOperand(func->getParamId(0));

	auto chain_index_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(),
	    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
	    spv::OpInBoundsAccessChain);
	chain_index_op->addIdOperand(cast_op->getResultId());
	chain_index_op->addIdOperand(builder.makeUintConstant(2));
	chain_index_op->addIdOperand(func->getParamId(1));

	auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
	atomic_op->addIdOperand(chain_index_op->getResultId());
	atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
	atomic_op->addIdOperand(total_count_id);

	auto *body = per_thread ? entry : body_block;
	add_instruction(body, std::move(cast_op));
	add_instruction(body, std::move(chain_index_op));
	add_instruction(body, std::move(atomic_op));

	if (!per_thread)
	{
		spv::Id local_invocation_index = get_builtin_shader_input(spv::BuiltInLocalInvocationIndex);
		auto load_local_index = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_local_index->addIdOperand(local_invocation_index);

		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
		is_first_lane->addIdOperand(load_local_index->getResultId());
		is_first_lane->addIdOperand(builder.makeUintConstant(0));
		spv::Id is_first_lane_id = is_first_lane->getResultId();
		add_instruction(entry, std::move(load_local_index));
		add_instruction(entry, std::move(is_first_lane));

		builder.setBuildPoint(entry);
		builder.createSelectionMerge(merge_block, 0);
		builder.createConditionalBranch(is_first_lane_id, body_block, merge_block);

		builder.setBuildPoint(body_block);
		builder.createBranch(merge_block);
		builder.setBuildPoint(merge_block);
		builder.makeReturn(false);
	}
	else
	{
		builder.setBuildPoint(entry);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	call_id = func->getId();
	return func->getId();
}